

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OscPrintReceivedElements.cpp
# Opt level: O0

ostream * osc::operator<<(ostream *os,ReceivedPacket *p)

{
  bool bVar1;
  ostream *poVar2;
  undefined1 local_50 [8];
  ReceivedMessage m;
  ReceivedBundle b;
  ReceivedPacket *p_local;
  ostream *os_local;
  
  bVar1 = ReceivedPacket::IsBundle(p);
  if (bVar1) {
    ReceivedBundle::ReceivedBundle((ReceivedBundle *)&m.arguments_,p);
    poVar2 = operator<<(os,(ReceivedBundle *)&m.arguments_);
    std::operator<<(poVar2,"\n");
  }
  else {
    ReceivedMessage::ReceivedMessage((ReceivedMessage *)local_50,p);
    poVar2 = operator<<(os,(ReceivedMessage *)local_50);
    std::operator<<(poVar2,"\n");
  }
  return os;
}

Assistant:

std::ostream& operator<<( std::ostream & os, const ReceivedPacket& p )
{
    if( p.IsBundle() ){
        ReceivedBundle b(p);
        os << b << "\n";
    }else{
        ReceivedMessage m(p);
        os << m << "\n";
    }

    return os;
}